

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef llvm::sys::path::root_directory(StringRef path,Style style)

{
  size_t *this;
  char cVar1;
  char cVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  path *this_00;
  Style in_R8D;
  char *pcVar6;
  bool bVar7;
  StringRef SVar8;
  StringRef Suffix;
  StringRef path_00;
  undefined1 auStack_98 [8];
  const_iterator b;
  const_iterator pos;
  
  sVar5 = path.Length;
  this_00 = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)sVar5;
  path_00.Length._4_4_ = 0;
  begin((const_iterator *)auStack_98,this_00,path_00,in_R8D);
  pos.Component.Length = b.Component.Length;
  pos.Position = b.Position;
  pos.Path.Length = b.Path.Length;
  pos.Component.Data = b.Component.Data;
  b._40_8_ = auStack_98;
  pos.Path.Data = b.Path.Data;
  if (auStack_98 == (undefined1  [8])this_00) {
    pcVar4 = (char *)0x0;
    pcVar6 = (char *)0x0;
    if (b.Component.Length == sVar5) goto LAB_00dbdfff;
  }
  this = &b.Path.Length;
  if ((b.Component.Data < (char *)0x3) ||
     ((cVar1 = StringRef::operator[]((StringRef *)this,0), cVar1 != '/' &&
      (cVar1 != '\\' || style != windows)))) {
    bVar7 = false;
  }
  else {
    cVar1 = StringRef::operator[]((StringRef *)this,1);
    cVar2 = StringRef::operator[]((StringRef *)this,0);
    bVar7 = cVar1 == cVar2;
  }
  if (style == windows) {
    Suffix.Length = 1;
    Suffix.Data = ":";
    bVar3 = StringRef::endswith((StringRef *)&b.Path.Length,Suffix);
  }
  else {
    bVar3 = false;
  }
  if (((bVar3 | bVar7) == 1) &&
     ((const_iterator::operator++((const_iterator *)&b.S), (path *)b._40_8_ != this_00 ||
      (pos.Component.Length != sVar5)))) {
    cVar1 = StringRef::operator[]((StringRef *)&pos.Path.Length,0);
    pcVar4 = pos.Component.Data;
    pcVar6 = (char *)pos.Path.Length;
    if ((cVar1 == '/') || (style == windows && cVar1 == '\\')) goto LAB_00dbdfff;
  }
  pcVar4 = (char *)0x0;
  pcVar6 = (char *)0x0;
  if (bVar7 == false) {
    cVar1 = StringRef::operator[]((StringRef *)&b.Path.Length,0);
    if ((cVar1 == '/') ||
       (pcVar4 = (char *)0x0, pcVar6 = (char *)0x0, style == windows && cVar1 == '\\')) {
      pcVar4 = b.Component.Data;
      pcVar6 = (char *)b.Path.Length;
    }
  }
LAB_00dbdfff:
  SVar8.Length = (size_t)pcVar4;
  SVar8.Data = pcVar6;
  return SVar8;
}

Assistant:

StringRef root_directory(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if ((has_net || has_drive) &&
        // {C:,//net}, skip to the next component.
        (++pos != e) && is_separator((*pos)[0], style)) {
      return *pos;
    }

    // POSIX style root directory.
    if (!has_net && is_separator((*b)[0], style)) {
      return *b;
    }
  }

  // No path or no root.
  return StringRef();
}